

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++:48:11)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:48:11)>
          *this,ExceptionOrValue *output)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar1;
  long lVar2;
  undefined8 uVar3;
  ExceptionOr<kj::Promise<void>_> *this_00;
  int iVar4;
  undefined4 extraout_var;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *pAVar5;
  undefined4 extraout_var_00;
  long extraout_RDX;
  long extraout_RDX_00;
  char *pcVar6;
  char *__n;
  ulong uVar7;
  long lVar8;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  Fault local_418;
  SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_test_c__:48:11)>
  *local_410;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined8 local_3e0;
  char local_3d8;
  Maybe<capnp::MessageReaderAndFds> local_3d0;
  ExceptionOr<kj::Promise<void>_> *local_3a8;
  ExceptionOr<kj::Promise<void>_> local_3a0;
  ExceptionOrValue local_1f8;
  char local_60;
  Maybe<capnp::MessageReaderAndFds> local_58;
  void *__s2;
  
  local_1f8.exception.ptr.isSet = false;
  local_60 = '\0';
  local_410 = this;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f8);
  uVar3 = local_1f8.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1f8.exception.ptr.isSet == true) {
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1f8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1f8.exception.ptr.field_1.value.ownFile.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1f8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1f8.exception.ptr.field_1.value.file;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1f8.exception.ptr.field_1._32_8_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1f8.exception.ptr.field_1.value.description.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1f8.exception.ptr.field_1.value.description.content.size_;
    local_1f8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1f8.exception.ptr.field_1.value.description.content.disposer;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1f8.exception.ptr.field_1.value.context.ptr.disposer;
    local_1f8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar3;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1f8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1f8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1f8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_3a0.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1f8.exception.ptr.field_1 + 0x68),0x105);
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1f8.exception.ptr.field_1.value.details.builder.ptr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1f8.exception.ptr.field_1.value.details.builder.pos;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1f8.exception.ptr.field_1.value.details.builder.endPtr;
    local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1f8.exception.ptr.field_1.value.details.builder.disposer;
    local_1f8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1f8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_3a0.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3a0)
    ;
    aVar1 = local_3a0.value.ptr.field_1;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3a0.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  else {
    if (local_60 != '\x01') goto LAB_002db9a7;
    Maybe<capnp::MessageReaderAndFds>::Maybe(&local_3d0,&local_58);
    if (local_3d0.ptr.isSet != true) {
      Debug::Fault::Fault<kj::Exception::Type,char_const(&)[29]>
                ((Fault *)&local_408.value,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x3c,FAILED,(char *)0x0,"\"Reading first message failed\"",
                 (char (*) [29])"Reading first message failed");
      Debug::Fault::fatal((Fault *)&local_408.value);
    }
    local_408 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)
                local_3d0.ptr.field_1.value.fds.size_;
    local_400 = (char *)((ulong)local_400 & 0xffffffff00000000);
    local_3f8 = " == ";
    local_3f0 = &DAT_00000005;
    local_3e8 = (char *)CONCAT71(local_3e8._1_7_,local_3d0.ptr.field_1.value.fds.size_ == 0);
    if (local_3d0.ptr.field_1.value.fds.size_ != 0) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x32,FAILED,"result.fds.size() == 0","_kjCondition,",
                 (DebugComparison<unsigned_long,_int> *)&local_408.value);
      Debug::Fault::fatal(&local_418);
    }
    local_408._0_4_ =
         (*(local_3d0.ptr.field_1.value.reader.ptr)->_vptr_MessageReader[2])
                   (local_3d0.ptr.field_1.value.reader.ptr,
                    (ulong)(uint)((local_410->func).originalSegments)->size_);
    local_408._4_4_ = extraout_var;
    local_3f8 = (char *)0x0;
    local_3f0 = " == ";
    local_3e8 = &DAT_00000005;
    local_3e0 = CONCAT71(local_3e0._1_7_,extraout_RDX == 0);
    local_3a8 = (ExceptionOr<kj::Promise<void>_> *)output;
    if (extraout_RDX != 0) {
      Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<capnp::word_const>,decltype(nullptr)>&>
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                 ,0x33,FAILED,"result.reader->getSegment(originalSegments.size()) == nullptr",
                 "_kjCondition,",
                 (DebugComparison<kj::ArrayPtr<const_capnp::word>,_std::nullptr_t> *)
                 &local_408.value);
      Debug::Fault::fatal(&local_418);
    }
    pAVar5 = (local_410->func).originalSegments;
    local_400 = (char *)0x0;
    if (pAVar5->size_ != 0) {
      lVar8 = 8;
      uVar7 = 0;
      local_400 = (char *)0x0;
      do {
        aVar1 = *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *)
                 ((long)pAVar5->ptr + lVar8 + -8);
        lVar2 = *(long *)((long)&pAVar5->ptr->ptr + lVar8);
        iVar4 = (*(local_3d0.ptr.field_1.value.reader.ptr)->_vptr_MessageReader[2])
                          (local_3d0.ptr.field_1.value.reader.ptr,uVar7 & 0xffffffff);
        __s2 = (void *)CONCAT44(extraout_var_00,iVar4);
        __n = (char *)(lVar2 << 3);
        pcVar6 = (char *)(extraout_RDX_00 << 3);
        if (__n == pcVar6) {
          if (__n == (char *)0x0) {
            local_3d8 = true;
          }
          else {
            iVar4 = bcmp((void *)aVar1,__s2,(size_t)__n);
            local_3d8 = iVar4 == 0;
          }
        }
        else {
          local_3d8 = false;
        }
        local_3e8 = " == ";
        local_3e0 = 5;
        local_408 = aVar1;
        local_400 = __n;
        local_3f8 = (char *)__s2;
        local_3f0 = pcVar6;
        if ((bool)local_3d8 == false) {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>>&>
                    (&local_418,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc-test.c++"
                     ,0x38,FAILED,"oldSegment.asBytes() == newSegment.asBytes()","_kjCondition,",
                     (DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<const_unsigned_char>_>
                      *)&local_408.value);
          Debug::Fault::fatal(&local_418);
        }
        uVar7 = uVar7 + 1;
        pAVar5 = (local_410->func).originalSegments;
        lVar8 = lVar8 + 0x10;
      } while (uVar7 < pAVar5->size_);
    }
    readyNow();
    this_00 = local_3a8;
    uVar3 = local_3d0.ptr.field_1.value.reader.ptr;
    local_3a0.value.ptr.field_1 = local_408;
    if ((local_3d0.ptr.isSet == true) &&
       (local_3d0.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
      local_3d0.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
      (**(local_3d0.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                (local_3d0.ptr.field_1.value.reader.disposer,
                 (code *)((long)((MessageReader *)uVar3)->arenaSpace +
                         (long)(((MessageReader *)uVar3)->_vptr_MessageReader[-2] + -0x18)));
    }
    local_3a0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a0.value.ptr.isSet = true;
    ExceptionOr<kj::Promise<void>_>::operator=(this_00,&local_3a0);
    aVar1 = local_3a0.value.ptr.field_1;
    if ((local_3a0.value.ptr.isSet == true) &&
       (local_3a0.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_3a0.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  if (local_3a0.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_3a0.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_002db9a7:
  uVar3 = local_58.ptr.field_1.value.reader.ptr;
  if (((local_60 == '\x01') && (local_58.ptr.isSet == true)) &&
     (local_58.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
    local_58.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
    (**(local_58.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
              (local_58.ptr.field_1.value.reader.disposer,
               (code *)((long)((MessageReader *)uVar3)->arenaSpace +
                       (long)(((MessageReader *)uVar3)->_vptr_MessageReader[-2] + -0x18)));
  }
  if (local_1f8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }